

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTDMT_getMTCtxParameter(ZSTDMT_CCtx *mtctx,ZSTDMT_parameter parameter,int *value)

{
  ulong uVar1;
  
  if (parameter == ZSTDMT_p_rsyncable) {
    uVar1 = (ulong)(uint)(mtctx->params).rsyncable;
  }
  else if (parameter == ZSTDMT_p_overlapLog) {
    uVar1 = (ulong)(uint)(mtctx->params).overlapLog;
  }
  else {
    if (parameter != ZSTDMT_p_jobSize) {
      return 0xffffffffffffffd8;
    }
    uVar1 = (mtctx->params).jobSize;
    if ((uVar1 & 0xffffffff80000000) != 0) {
      __assert_fail("CCtxParams->jobSize <= INT_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2d54,
                    "size_t ZSTD_CCtxParams_getParameter(ZSTD_CCtx_params *, ZSTD_cParameter, int *)"
                   );
    }
  }
  *value = (int)uVar1;
  return 0;
}

Assistant:

size_t ZSTDMT_getMTCtxParameter(ZSTDMT_CCtx* mtctx, ZSTDMT_parameter parameter, int* value)
{
    switch (parameter) {
    case ZSTDMT_p_jobSize:
        return ZSTD_CCtxParams_getParameter(&mtctx->params, ZSTD_c_jobSize, value);
    case ZSTDMT_p_overlapLog:
        return ZSTD_CCtxParams_getParameter(&mtctx->params, ZSTD_c_overlapLog, value);
    case ZSTDMT_p_rsyncable:
        return ZSTD_CCtxParams_getParameter(&mtctx->params, ZSTD_c_rsyncable, value);
    default:
        return ERROR(parameter_unsupported);
    }
}